

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::OwnFd> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFileInternal
          (DiskHandle *this,PathPtr path,WriteMode mode,bool append)

{
  uint __oflag;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int code;
  NullableValue<kj::OwnFd> extraout_RAX;
  NullableValue<kj::OwnFd> extraout_RAX_00;
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 extraout_var;
  NullableValue<kj::OwnFd> extraout_RAX_01;
  undefined4 in_register_0000000c;
  char *pcVar5;
  char in_R9B;
  PathPtr path_00;
  PathPtr path_01;
  char local_68;
  Fault f;
  PathPtr path_local;
  String filename;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  path_00.parts.ptr = path.parts.ptr;
  if (append) {
    local_68 = (char)((append & 2) >> 1);
    uVar3 = (uint)((append & 2U) == 0) << 7 | 0x80042;
  }
  else {
    if ((append & 2U) == 0) {
      *(undefined1 *)&(this->fd).fd = 0;
      return (Maybe<kj::OwnFd>)(NullableValue<kj::OwnFd>)this;
    }
    uVar3 = 0x80002;
    local_68 = '\x01';
  }
  __oflag = uVar3 | 0x400;
  if (in_R9B == '\0') {
    __oflag = uVar3;
  }
  PathPtr::toString(&filename,&path_local,false);
  do {
    pcVar5 = "";
    if (filename.content.size_ != 0) {
      pcVar5 = filename.content.ptr;
    }
    iVar4 = openat64(*(int *)&((path_00.parts.ptr)->content).ptr,pcVar5,__oflag);
    if (-1 < iVar4) goto LAB_001fb0f8;
    code = kj::_::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code < 0x11) {
    if (code == 0) {
LAB_001fb0f8:
      *(undefined1 *)&(this->fd).fd = 1;
      this[1].fd.fd = iVar4;
      f.exception._0_4_ = 0xffffffff;
      OwnFd::~OwnFd((OwnFd *)&f);
      this = (DiskHandle *)extraout_RAX;
      goto LAB_001fb19f;
    }
    if (code != 2) goto LAB_001fb11f;
    if (append) {
      if (((append & 4U) != 0) && (path_local.parts.size_ != 0)) {
        path_01 = PathPtr::parent(&path_local);
        bVar2 = tryMkdir((DiskHandle *)path_00.parts.ptr,path_01,CREATE_PARENT|MODIFY|CREATE,true);
        if (bVar2) {
          path_00.parts.size_ = (size_t)path_local.parts.ptr;
          this = (DiskHandle *)
                 tryOpenFileInternal(this,path_00,(WriteMode)path_local.parts.size_,
                                     (bool)(append & 0xfb));
          goto LAB_001fb19f;
        }
      }
      if (local_68 == '\0') {
        pcVar5 = filename.content.ptr;
        if (filename.content.size_ == 0) {
          pcVar5 = "";
        }
        iVar4 = faccessat(*(int *)&((path_00.parts.ptr)->content).ptr,pcVar5,0,0x100);
        if (-1 < iVar4) goto LAB_001fb197;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x413,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                 (char (*) [26])"parent is not a directory",&path_local);
      *(undefined1 *)&(this->fd).fd = 0;
      kj::_::Debug::Fault::~Fault(&f);
      this = (DiskHandle *)extraout_RAX_01;
      goto LAB_001fb19f;
    }
  }
  else if (code == 0x11) {
    if (local_68 != '\0') goto LAB_001fb11f;
  }
  else if ((code != 0x14) || (append)) {
LAB_001fb11f:
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x426,code,"openat(fd, path, O_RDWR | ...)","path",&path_local);
    *(undefined1 *)&(this->fd).fd = 0;
    kj::_::Debug::Fault::~Fault(&f);
    this = (DiskHandle *)extraout_RAX_00;
    goto LAB_001fb19f;
  }
LAB_001fb197:
  *(undefined1 *)&(this->fd).fd = 0;
LAB_001fb19f:
  sVar1 = filename.content.size_;
  pcVar5 = filename.content.ptr;
  if (filename.content.ptr != (char *)0x0) {
    filename.content.ptr = (char *)0x0;
    filename.content.size_ = 0;
    this._0_4_ = (**(filename.content.disposer)->_vptr_ArrayDisposer)
                           (filename.content.disposer,pcVar5,1,sVar1,sVar1,0);
    this._4_4_ = extraout_var;
  }
  return (Maybe<kj::OwnFd>)this;
}

Assistant:

Maybe<OwnFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return kj::none;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return kj::none;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return kj::none; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return kj::none;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return kj::none;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return kj::none;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }